

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

double __thiscall HighsLpRelaxation::slackLower(HighsLpRelaxation *this,HighsInt row)

{
  pointer pLVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  double dVar3;
  
  pLVar1 = (this->lprows).
           super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pLVar1[row].origin == kModel) {
    dVar3 = (this->lpsolver).model_.lp_.row_lower_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[row];
    if (-INFINITY < dVar3) {
      return dVar3;
    }
    dVar3 = HighsDomain::getMinActivity
                      (&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain,
                       pLVar1[row].index);
    return dVar3;
  }
  if (pLVar1[row].origin == kCutPool) {
    _Var2._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    dVar3 = HighsDomain::getMinCutActivity
                      (&(_Var2._M_head_impl)->domain,&(_Var2._M_head_impl)->cutpool,
                       pLVar1[row].index);
    return dVar3;
  }
  return -INFINITY;
}

Assistant:

double HighsLpRelaxation::slackLower(HighsInt row) const {
  switch (lprows[row].origin) {
    case LpRow::kCutPool:
      return mipsolver.mipdata_->domain.getMinCutActivity(
          mipsolver.mipdata_->cutpool, lprows[row].index);
    case LpRow::kModel:
      double rowlower = rowLower(row);
      if (rowlower != -kHighsInf) return rowlower;
      return mipsolver.mipdata_->domain.getMinActivity(lprows[row].index);
  };

  assert(false);
  return -kHighsInf;
}